

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O1

void __thiscall llama_file::impl::impl(impl *this,char *fname,char *mode)

{
  FILE *pFVar1;
  size_t sVar2;
  runtime_error *this_00;
  int *piVar3;
  char *pcVar4;
  string sStack_38;
  
  pFVar1 = (FILE *)ggml_fopen(fname);
  this->fp = pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    seek(this,0,2);
    sVar2 = tell(this);
    this->size = sVar2;
    seek(this,0,0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  format_abi_cxx11_(&sStack_38,"failed to open %s: %s",fname,pcVar4);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

impl(const char * fname, const char * mode) {
        fp = ggml_fopen(fname, mode);
        if (fp == NULL) {
            throw std::runtime_error(format("failed to open %s: %s", fname, strerror(errno)));
        }
        seek(0, SEEK_END);
        size = tell();
        seek(0, SEEK_SET);
    }